

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O2

void __thiscall
TasOptimization::ParticleSwarmState::setBestParticlePositions
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *bpp)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"ParticleSwarmState::setBestParticlePositions",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"best particle positions",&local_52);
  checkVarSize(&local_30,&local_50,
               (int)((ulong)((long)(bpp->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(bpp->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                  .super__Vector_impl_data._M_start) >> 3),
               (this->num_particles + 1) * this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::vector<double,_std::allocator<double>_>::operator=(&this->best_particle_positions,bpp);
  this->best_positions_initialized = true;
  return;
}

Assistant:

void setBestParticlePositions(const std::vector<double> &bpp) {
        checkVarSize("ParticleSwarmState::setBestParticlePositions", "best particle positions", bpp.size(), num_dimensions * (num_particles + 1));
        best_particle_positions = bpp;
        best_positions_initialized = true;
    }